

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

CURLcode Curl_http_auth_act(connectdata *conn)

{
  int iVar1;
  Curl_HttpReq CVar2;
  Curl_easy *data;
  Curl_easy *pCVar3;
  bool bVar4;
  _Bool _Var5;
  CURLcode CVar6;
  char *pcVar7;
  
  data = conn->data;
  iVar1 = (data->req).httpcode;
  if (iVar1 - 100U < 100) {
    return CURLE_OK;
  }
  if ((data->state).authproblem == true) {
    if ((data->set).http_fail_on_error == false) {
      return CURLE_OK;
    }
    return CURLE_HTTP_RETURNED_ERROR;
  }
  if ((conn->bits).user_passwd == true) {
    if (iVar1 == 0x191) {
LAB_00111078:
      _Var5 = pickoneauth(&(data->state).authhost);
      bVar4 = true;
      if (!_Var5) {
        (data->state).authproblem = true;
        goto LAB_00111092;
      }
    }
    else {
      bVar4 = false;
      if ((iVar1 < 300) && (bVar4 = false, (conn->bits).authneg != false)) goto LAB_00111078;
    }
  }
  else {
LAB_00111092:
    bVar4 = false;
  }
  if (((conn->bits).proxy_user_passwd == true) &&
     ((iVar1 = (data->req).httpcode, iVar1 == 0x197 ||
      ((iVar1 < 300 && ((conn->bits).authneg != false)))))) {
    _Var5 = pickoneauth(&(data->state).authproxy);
    if (!_Var5) {
      (data->state).authproblem = true;
      goto LAB_001110e7;
    }
    _Var5 = true;
    if (bVar4) {
      Curl_http_input_auth_init_ctx(conn,false);
    }
LAB_001110ef:
    Curl_http_input_auth_init_ctx(conn,_Var5);
    (*Curl_cfree)((data->req).newurl);
    (data->req).newurl = (char *)0x0;
    pcVar7 = (*Curl_cstrdup)((data->change).url);
    (data->req).newurl = pcVar7;
    if (pcVar7 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    CVar2 = (data->set).httpreq;
    if (((CVar2 != HTTPREQ_GET) && (CVar2 != HTTPREQ_HEAD)) &&
       (((conn->bits).rewindaftersend == false &&
        (CVar6 = http_perhapsrewind(conn), CVar6 != CURLE_OK)))) {
      return CVar6;
    }
  }
  else {
LAB_001110e7:
    if (bVar4) {
      _Var5 = false;
      goto LAB_001110ef;
    }
    if (((((data->req).httpcode < 300) && ((data->state).authhost.done == false)) &&
        ((conn->bits).authneg == true)) &&
       ((CVar2 = (data->set).httpreq, CVar2 != HTTPREQ_GET && (CVar2 != HTTPREQ_HEAD)))) {
      pcVar7 = (*Curl_cstrdup)((data->change).url);
      (data->req).newurl = pcVar7;
      if (pcVar7 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      (data->state).authhost.done = true;
    }
  }
  pCVar3 = conn->data;
  iVar1 = (pCVar3->req).httpcode;
  if ((399 < iVar1 & (pCVar3->set).http_fail_on_error) != 1) {
    return CURLE_OK;
  }
  if (iVar1 == 0x197) {
    if ((conn->bits).proxy_user_passwd != true) goto LAB_0011120c;
  }
  else if ((iVar1 != 0x191) || ((conn->bits).user_passwd == false)) goto LAB_0011120c;
  if ((pCVar3->state).authproblem == false) {
    return CURLE_OK;
  }
LAB_0011120c:
  Curl_failf(data,"The requested URL returned error: %d",(ulong)(uint)(data->req).httpcode);
  return CURLE_HTTP_RETURNED_ERROR;
}

Assistant:

CURLcode Curl_http_auth_act(struct connectdata *conn)
{
  struct Curl_easy *data = conn->data;
  bool pickhost = FALSE;
  bool pickproxy = FALSE;
  CURLcode result = CURLE_OK;

  if(100 <= data->req.httpcode && 199 >= data->req.httpcode)
    /* this is a transient response code, ignore */
    return CURLE_OK;

  if(data->state.authproblem)
    return data->set.http_fail_on_error?CURLE_HTTP_RETURNED_ERROR:CURLE_OK;

  if(conn->bits.user_passwd &&
     ((data->req.httpcode == 401) ||
      (conn->bits.authneg && data->req.httpcode < 300))) {
    pickhost = pickoneauth(&data->state.authhost);
    if(!pickhost)
      data->state.authproblem = TRUE;
  }
  if(conn->bits.proxy_user_passwd &&
     ((data->req.httpcode == 407) ||
      (conn->bits.authneg && data->req.httpcode < 300))) {
    pickproxy = pickoneauth(&data->state.authproxy);
    if(!pickproxy)
      data->state.authproblem = TRUE;
  }

  if(pickhost || pickproxy) {
    if(pickhost)
      Curl_http_input_auth_init_ctx(conn, false);
    if(pickproxy)
      Curl_http_input_auth_init_ctx(conn, true);

    /* In case this is GSS auth, the newurl field is already allocated so
       we must make sure to free it before allocating a new one. As figured
       out in bug #2284386 */
    Curl_safefree(data->req.newurl);
    data->req.newurl = strdup(data->change.url); /* clone URL */
    if(!data->req.newurl)
      return CURLE_OUT_OF_MEMORY;

    if((data->set.httpreq != HTTPREQ_GET) &&
       (data->set.httpreq != HTTPREQ_HEAD) &&
       !conn->bits.rewindaftersend) {
      result = http_perhapsrewind(conn);
      if(result)
        return result;
    }
  }
  else if((data->req.httpcode < 300) &&
          (!data->state.authhost.done) &&
          conn->bits.authneg) {
    /* no (known) authentication available,
       authentication is not "done" yet and
       no authentication seems to be required and
       we didn't try HEAD or GET */
    if((data->set.httpreq != HTTPREQ_GET) &&
       (data->set.httpreq != HTTPREQ_HEAD)) {
      data->req.newurl = strdup(data->change.url); /* clone URL */
      if(!data->req.newurl)
        return CURLE_OUT_OF_MEMORY;
      data->state.authhost.done = TRUE;
    }
  }
  if(http_should_fail(conn)) {
    failf(data, "The requested URL returned error: %d",
          data->req.httpcode);
    result = CURLE_HTTP_RETURNED_ERROR;
  }

  return result;
}